

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall
nonius::junit_reporter::do_analysis_complete
          (junit_reporter *this,
          sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *analysis)

{
  pointer pdVar1;
  pointer pdVar2;
  void *pvVar3;
  void *pvVar4;
  void *__tmp;
  mapped_type *pmVar5;
  long lVar6;
  estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *peVar7;
  rep *prVar8;
  byte bVar9;
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  local_98;
  rep local_80 [12];
  void *local_20;
  
  bVar9 = 0;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::vector(&local_98,&analysis->samples);
  peVar7 = &analysis->mean;
  prVar8 = local_80;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    *prVar8 = (peVar7->point).__r;
    peVar7 = (estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)
             ((long)peVar7 + (ulong)bVar9 * -0x10 + 8);
    prVar8 = prVar8 + (ulong)bVar9 * -2 + 1;
  }
  local_20 = (void *)0x0;
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->data,&this->current);
  pdVar1 = (pmVar5->analysis).samples.
           super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (pmVar5->analysis).samples.
           super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar5->analysis).samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pmVar5->analysis).samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pmVar5->analysis).samples.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
  }
  pvVar4 = local_20;
  prVar8 = local_80;
  peVar7 = &(pmVar5->analysis).mean;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    (peVar7->point).__r = *prVar8;
    prVar8 = prVar8 + (ulong)bVar9 * -2 + 1;
    peVar7 = (estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)
             ((long)peVar7 + (ulong)bVar9 * -0x10 + 8);
  }
  local_20 = (void *)0x0;
  pvVar3 = (pmVar5->failure)._M_exception_object;
  (pmVar5->failure)._M_exception_object = pvVar4;
  if (pvVar3 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_98.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void do_analysis_complete(sample_analysis<fp_seconds> const& analysis) override {
            data[current] = { analysis, nullptr };
        }